

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O1

bool __thiscall SemanticAnalyzer::isValid(SemanticAnalyzer *this,shared_ptr<ScriptAstNode> *script)

{
  ostream *out;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 local_e0 [8];
  SemanticAnalyzerRun run;
  
  out = this->out;
  run.currentScope.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (this->reader).super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->reader).super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  SemanticAnalyzerRun::SemanticAnalyzerRun
            ((SemanticAnalyzerRun *)local_e0,out,
             (shared_ptr<const_Readable> *)
             &run.currentScope.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  AstWalker::visitScriptAstNode
            ((AstWalker *)local_e0,
             (script->super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  SemanticAnalyzerRun::~SemanticAnalyzerRun((SemanticAnalyzerRun *)local_e0);
  return (bool)((byte)run.builtInFunctionArgumentCounts._M_h._M_single_bucket ^ 1);
}

Assistant:

bool SemanticAnalyzer::isValid(const std::shared_ptr<ScriptAstNode>& script) noexcept {

  SemanticAnalyzerRun run{this->out, this->reader};

  run.visitScriptAstNode(script.get());

  return !run.hasErrors();
}